

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

int amqp_simple_wait_frame_on_channel
              (amqp_connection_state_t state,amqp_channel_t channel,amqp_frame_t *decoded_frame)

{
  int iVar1;
  void *in_RDX;
  short in_SI;
  long in_RDI;
  int res;
  amqp_link_t *cur;
  amqp_frame_t *frame_ptr;
  timeval *in_stack_00000048;
  amqp_frame_t *in_stack_00000050;
  amqp_connection_state_t in_stack_00000058;
  undefined8 *puVar2;
  amqp_frame_t *frame;
  amqp_connection_state_t in_stack_ffffffffffffffd8;
  
  for (puVar2 = *(undefined8 **)(in_RDI + 0xf0); puVar2 != (undefined8 *)0x0;
      puVar2 = (undefined8 *)*puVar2) {
    in_stack_ffffffffffffffd8 = (amqp_connection_state_t)puVar2[1];
    if (in_SI == *(short *)((long)in_stack_ffffffffffffffd8->pool_table + 2)) {
      *(undefined8 *)(in_RDI + 0xf0) = *puVar2;
      if (*(long *)(in_RDI + 0xf0) == 0) {
        *(undefined8 *)(in_RDI + 0xf8) = 0;
      }
      memcpy(in_RDX,in_stack_ffffffffffffffd8,0x30);
      return 0;
    }
  }
  frame = (amqp_frame_t *)0x0;
  while( true ) {
    iVar1 = wait_frame_inner(in_stack_00000058,in_stack_00000050,in_stack_00000048);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (in_SI == *(short *)((long)in_RDX + 2)) break;
    iVar1 = amqp_queue_frame(in_stack_ffffffffffffffd8,frame);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  return 0;
}

Assistant:

int amqp_simple_wait_frame_on_channel(amqp_connection_state_t state,
                                      amqp_channel_t channel,
                                      amqp_frame_t *decoded_frame)
{
  amqp_frame_t *frame_ptr;
  amqp_link_t *cur;
  int res;

  for (cur = state->first_queued_frame; NULL != cur; cur = cur->next) {
    frame_ptr = cur->data;

    if (channel == frame_ptr->channel) {
      state->first_queued_frame = cur->next;
      if (NULL == state->first_queued_frame) {
        state->last_queued_frame = NULL;
      }

      *decoded_frame = *frame_ptr;

      return AMQP_STATUS_OK;
    }
  }

  while (1) {
    res = wait_frame_inner(state, decoded_frame, NULL);

    if (AMQP_STATUS_OK != res) {
      return res;
    }

    if (channel == decoded_frame->channel) {
      return AMQP_STATUS_OK;
    } else {
      res = amqp_queue_frame(state, decoded_frame);
      if (res != AMQP_STATUS_OK) {
        return res;
      }
    }
  }
}